

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O0

void __thiscall Meter::paintEvent(Meter *this,QPaintEvent *param_1)

{
  MeterPrivate *pMVar1;
  undefined1 local_80 [8];
  DrawParams params;
  QPainter local_20 [8];
  QPainter p;
  QPaintEvent *param_1_local;
  Meter *this_local;
  
  _p = param_1;
  QPainter::QPainter(local_20,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)local_20,true);
  QPainter::translate(local_20,1.0,1.0);
  MeterPrivate::DrawParams::DrawParams((DrawParams *)local_80);
  pMVar1 = QScopedPointer<MeterPrivate,_QScopedPointerDeleter<MeterPrivate>_>::operator->(&this->d);
  MeterPrivate::drawBackground(pMVar1,local_20,(DrawParams *)local_80);
  pMVar1 = QScopedPointer<MeterPrivate,_QScopedPointerDeleter<MeterPrivate>_>::operator->(&this->d);
  MeterPrivate::drawRanges(pMVar1,local_20,(DrawParams *)local_80);
  pMVar1 = QScopedPointer<MeterPrivate,_QScopedPointerDeleter<MeterPrivate>_>::operator->(&this->d);
  MeterPrivate::drawScale(pMVar1,local_20,(DrawParams *)local_80);
  pMVar1 = QScopedPointer<MeterPrivate,_QScopedPointerDeleter<MeterPrivate>_>::operator->(&this->d);
  MeterPrivate::drawLabels(pMVar1,local_20,(DrawParams *)local_80);
  pMVar1 = QScopedPointer<MeterPrivate,_QScopedPointerDeleter<MeterPrivate>_>::operator->(&this->d);
  MeterPrivate::drawNeedle(pMVar1,local_20,(DrawParams *)local_80);
  QPainter::~QPainter(local_20);
  return;
}

Assistant:

void
Meter::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );
	p.translate( 1.0, 1.0 );

	MeterPrivate::DrawParams params;

	d->drawBackground( p, params );
	d->drawRanges( p, params );
	d->drawScale( p, params );
	d->drawLabels( p, params );
	d->drawNeedle( p, params );
}